

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

uint8_t * binToHex(uint8_t *src,size_t size)

{
  byte bVar1;
  uint64_t i;
  uint8_t *puVar2;
  size_t sVar3;
  
  if (src == (uint8_t *)0x0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    if (size == 0) {
      puVar2 = (uint8_t *)0x0;
    }
    else {
      puVar2 = (uint8_t *)calloc(size * 2 + 1,1);
      sVar3 = 0;
      do {
        bVar1 = src[sVar3];
        puVar2[sVar3 * 2] = hex_lookup[bVar1 >> 4].hex;
        puVar2[sVar3 * 2 + 1] = hex_lookup[bVar1 & 0xf].hex;
        sVar3 = sVar3 + 1;
      } while (size != sVar3);
    }
    free(src);
  }
  return puVar2;
}

Assistant:

uint8_t* binToHex(uint8_t* src, size_t size)
{
    //sanity checks
    if (src == NULL) { return NULL; }

    if (size == 0) 
    { 
        free(src);
	    return NULL;
    }

    //allocate storage for the hex buffer
    const uint64_t hex_size = 2*size;
    uint8_t* hex = calloc(hex_size+1, sizeof(uint8_t));

    for (uint64_t i=0; i<size; ++i)
    {
	    //split the byte into two nibble halves and look up their hex representation
        hex[(2*i)+0] = hexLookupNibble((src[i] & 0xf0) >> 4);
        hex[(2*i)+1] = hexLookupNibble(src[i] & 0x0f);
    }      

    //free the original buffer and return the hex
    free(src);

    return hex;
}